

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

unsigned_long __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::PushElement<unsigned_long,unsigned_long>
          (FlatBufferBuilderImpl<true> *this,unsigned_long element)

{
  unsigned_long uVar1;
  unsigned_long local_18;
  
  Align(this,8);
  local_18 = element;
  vector_downward<unsigned_long>::push_small<unsigned_long>(&this->buf_,&local_18);
  uVar1 = (this->buf_).size_;
  this->length_of_64_bit_region_ = uVar1;
  return uVar1;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }